

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O0

void __thiscall
chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<unsigned_int> *bVal)

{
  char *pcVar1;
  ChStreamOutAscii *pCVar2;
  uint *puVar3;
  ChNameValue<unsigned_int> *bVal_local;
  ChArchiveAsciiDump *this_local;
  
  indent(this);
  if ((this->suppress_names & 1U) == 0) {
    pCVar2 = this->ostream;
    pcVar1 = ChNameValue<unsigned_int>::name(bVal);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,pcVar1);
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t");
  }
  pCVar2 = this->ostream;
  puVar3 = ChNameValue<unsigned_int>::value(bVal);
  chrono::ChStreamOutAscii::operator<<(pCVar2,*puVar3);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<unsigned int> bVal){
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }